

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmutil.c
# Opt level: O3

PmError Pm_QueueDestroy(PmQueue *q)

{
  PmError PVar1;
  PmQueueRep *queue;
  
  PVar1 = pmBadPtr;
  if (((q != (PmQueue *)0x0) && (PVar1 = pmBadPtr, *(long *)((long)q + 0x28) != 0)) &&
     (*(void **)((long)q + 0x30) != (void *)0x0)) {
    pm_free(*(void **)((long)q + 0x30));
    pm_free(*(void **)((long)q + 0x28));
    pm_free(q);
    PVar1 = pmNoData;
  }
  return PVar1;
}

Assistant:

PMEXPORT PmError Pm_QueueDestroy(PmQueue *q)
{
    PmQueueRep *queue = (PmQueueRep *) q;
        
    /* arg checking */
    if (!queue || !queue->buffer || !queue->peek) 
                return pmBadPtr;
    
    pm_free(queue->peek);
    pm_free(queue->buffer);
    pm_free(queue);
    return pmNoError;
}